

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O2

void __thiscall duckdb::WindowLocalSourceState::Sink(WindowLocalSourceState *this)

{
  optional_ptr<duckdb::WindowHashGroup,_true> *this_00;
  DataChunk *this_01;
  WindowGlobalSinkState *gsink;
  idx_t iVar1;
  idx_t iVar2;
  _Head_base<0UL,_duckdb::WindowCollection_*,_false> args;
  unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  uVar3;
  unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
  *puVar4;
  tuple<duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_> chunk;
  DataChunk *result;
  unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>,_true> *this_02;
  WindowHashGroup *pWVar5;
  WindowSourceTask *pWVar6;
  pointer pRVar7;
  pointer pWVar8;
  const_reference pvVar9;
  pointer pWVar10;
  reference pvVar11;
  type pWVar12;
  reference this_03;
  type pWVar13;
  pointer *__ptr;
  idx_t w;
  ulong uVar14;
  _Head_base<0UL,_duckdb::RowDataCollection_*,_false> this_04;
  _Head_base<0UL,_duckdb::WindowExecutorLocalState_*,_false> local_98;
  unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
  *local_90;
  optional_ptr<duckdb::WindowHashGroup,_true> *local_88;
  _Head_base<0UL,_duckdb::RowDataCollection_*,_false> local_80;
  _Head_base<0UL,_duckdb::RowDataCollection_*,_false> local_78;
  WindowLocalSourceState *local_70;
  pointer local_68;
  pointer local_60;
  Executors *local_58;
  DataChunk *local_50;
  ExpressionExecutor *local_48;
  unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>,_true> *local_40;
  ExpressionExecutor *local_38;
  
  gsink = this->gsource->gsink;
  local_58 = &gsink->executors;
  this_00 = &this->window_hash_group;
  pWVar5 = optional_ptr<duckdb::WindowHashGroup,_true>::operator->(this_00);
  local_60 = (pointer)WindowHashGroup::Initialize(pWVar5,gsink);
  local_88 = this_00;
  pWVar5 = optional_ptr<duckdb::WindowHashGroup,_true>::operator->(this_00);
  local_78._M_head_impl = (RowDataCollection *)&this->task;
  pWVar6 = optional_ptr<duckdb::WindowSourceTask,_true>::operator->
                     ((optional_ptr<duckdb::WindowSourceTask,_true> *)local_78._M_head_impl);
  local_68 = (pointer)::std::
                      vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
                      ::at(&(pWVar5->thread_states).
                            super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
                           ,pWVar6->thread_idx);
  if (*(element_type **)local_68 ==
      (local_68->type_info_).internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    for (uVar14 = 0;
        uVar14 < (ulong)((long)(gsink->executors).
                               super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(gsink->executors).
                               super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar14 = uVar14 + 1)
    {
      pvVar9 = vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_true>
               ::get<true>(local_58,uVar14);
      pWVar10 = unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>
                ::operator->(pvVar9);
      pvVar11 = vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_true>
                ::get<true>((vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_true>
                             *)local_60,uVar14);
      pWVar12 = unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>
                ::operator*(pvVar11);
      (*pWVar10->_vptr_WindowExecutor[3])(&stack0xffffffffffffff68,pWVar10,pWVar12);
      ::std::
      vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,std::default_delete<duckdb::WindowExecutorLocalState>,true>,std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,std::default_delete<duckdb::WindowExecutorLocalState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,std::default_delete<duckdb::WindowExecutorLocalState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,std::default_delete<duckdb::WindowExecutorLocalState>,true>,std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,std::default_delete<duckdb::WindowExecutorLocalState>,true>>>
                  *)local_68,
                 (unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>
                  *)&stack0xffffffffffffff68);
      if (local_98._M_head_impl != (WindowExecutorLocalState *)0x0) {
        (**(code **)(*(long *)local_98._M_head_impl + 8))();
      }
    }
  }
  local_90 = &this->scanner;
  local_80._M_head_impl = (RowDataCollection *)&this->input_chunk;
  this_01 = &this->coll_chunk;
  local_38 = &this->coll_exec;
  local_40 = &this->builder;
  local_50 = &this->sink_chunk;
  local_48 = &this->sink_exec;
  this_04._M_head_impl = local_78._M_head_impl;
  local_70 = this;
  while( true ) {
    pWVar6 = optional_ptr<duckdb::WindowSourceTask,_true>::operator->
                       ((optional_ptr<duckdb::WindowSourceTask,_true> *)this_04._M_head_impl);
    uVar14 = pWVar6->begin_idx;
    pWVar6 = optional_ptr<duckdb::WindowSourceTask,_true>::operator->
                       ((optional_ptr<duckdb::WindowSourceTask,_true> *)this_04._M_head_impl);
    if (pWVar6->end_idx <= uVar14) {
      return;
    }
    pWVar5 = optional_ptr<duckdb::WindowHashGroup,_true>::operator->(local_88);
    optional_ptr<duckdb::WindowSourceTask,_true>::operator->
              ((optional_ptr<duckdb::WindowSourceTask,_true> *)this_04._M_head_impl);
    WindowHashGroup::GetBuildScanner((WindowHashGroup *)&stack0xffffffffffffff68,(idx_t)pWVar5);
    puVar4 = local_90;
    uVar3._M_t.
    super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
    .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true,_true>
          )(__uniq_ptr_data<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true,_true>
            )local_98._M_head_impl;
    local_98._M_head_impl = (WindowExecutorLocalState *)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
    ::reset((__uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
             *)local_90,
            (pointer)uVar3._M_t.
                     super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                     .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl)
    ;
    ::std::
    unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
    ::~unique_ptr((unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                   *)&stack0xffffffffffffff68);
    if ((puVar4->
        super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
        )._M_t.
        super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
        .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl ==
        (RowDataCollectionScanner *)0x0) break;
    while( true ) {
      puVar4 = local_90;
      pRVar7 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
               ::operator->(local_90);
      chunk.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
            )(_Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
              )local_80._M_head_impl;
      iVar1 = pRVar7->total_scanned;
      DataChunk::Reset((DataChunk *)local_80._M_head_impl);
      pRVar7 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
               ::operator->(puVar4);
      RowDataCollectionScanner::Scan
                (pRVar7,(DataChunk *)
                        chunk.
                        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl);
      puVar4 = local_90;
      iVar2 = (this->input_chunk).count;
      if (iVar2 == 0) break;
      if ((this->coll_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->coll_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        (this->coll_chunk).count = iVar2;
      }
      else {
        DataChunk::Reset(this_01);
        ExpressionExecutor::Execute(local_38,(DataChunk *)local_80._M_head_impl,this_01);
        pWVar5 = optional_ptr<duckdb::WindowHashGroup,_true>::operator->(local_88);
        this_02 = local_40;
        args._M_head_impl =
             (pWVar5->collection).
             super_unique_ptr<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::WindowCollection_*,_std::default_delete<duckdb::WindowCollection>_>
             .super__Head_base<0UL,_duckdb::WindowCollection_*,_false>._M_head_impl;
        if (((local_40->
             super_unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::WindowBuilder_*,_std::default_delete<duckdb::WindowBuilder>_>
             .super__Head_base<0UL,_duckdb::WindowBuilder_*,_false>._M_head_impl ==
             (WindowBuilder *)0x0) ||
           (pWVar8 = unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>,_true>
                     ::operator->(local_40), pWVar8->collection != args._M_head_impl)) {
          make_uniq<duckdb::WindowBuilder,duckdb::WindowCollection&>
                    ((duckdb *)&stack0xffffffffffffff68,args._M_head_impl);
          uVar3._M_t.
          super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
          .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl =
               (__uniq_ptr_data<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true,_true>
                )(__uniq_ptr_data<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true,_true>
                  )local_98._M_head_impl;
          local_98._M_head_impl = (WindowExecutorLocalState *)0x0;
          ::std::__uniq_ptr_impl<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>_>
          ::reset((__uniq_ptr_impl<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>_>
                   *)this_02,
                  (pointer)uVar3._M_t.
                           super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                           .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>.
                           _M_head_impl);
          ::std::unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>_>::
          ~unique_ptr((unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>_>
                       *)&stack0xffffffffffffff68);
        }
        pWVar8 = unique_ptr<duckdb::WindowBuilder,_std::default_delete<duckdb::WindowBuilder>,_true>
                 ::operator->(this_02);
        WindowBuilder::Sink(pWVar8,this_01,iVar1);
        this = local_70;
      }
      result = local_50;
      if ((this->sink_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->sink_chunk).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        (this->sink_chunk).count = (this->input_chunk).count;
      }
      else {
        DataChunk::Reset(local_50);
        ExpressionExecutor::Execute(local_48,(DataChunk *)local_80._M_head_impl,result);
      }
      for (uVar14 = 0; this = local_70,
          uVar14 < (ulong)((long)(gsink->executors).
                                 super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(gsink->executors).
                                 super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar14 = uVar14 + 1) {
        pvVar9 = vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_true>
                 ::get<true>(local_58,uVar14);
        pWVar10 = unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>
                  ::operator->(pvVar9);
        pvVar11 = vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_true>
                  ::get<true>((vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_true>
                               *)local_60,uVar14);
        pWVar12 = unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>
                  ::operator*(pvVar11);
        this_03 = vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>
                  ::get<true>((vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>
                               *)local_68,uVar14);
        pWVar13 = unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>
                  ::operator*(this_03);
        (*pWVar10->_vptr_WindowExecutor[4])(pWVar10,local_50,this_01,iVar1,pWVar12,pWVar13);
      }
      iVar1 = (local_70->input_chunk).count;
      pWVar5 = optional_ptr<duckdb::WindowHashGroup,_true>::operator->(local_88);
      LOCK();
      (pWVar5->sunk).super___atomic_base<unsigned_long>._M_i =
           (pWVar5->sunk).super___atomic_base<unsigned_long>._M_i + iVar1;
      UNLOCK();
    }
    pRVar7 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
             ::operator->(local_90);
    this_04._M_head_impl = local_78._M_head_impl;
    pWVar6 = optional_ptr<duckdb::WindowSourceTask,_true>::operator->
                       ((optional_ptr<duckdb::WindowSourceTask,_true> *)local_78._M_head_impl);
    RowDataCollectionScanner::SwizzleBlock(pRVar7,pWVar6->begin_idx);
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
    ::reset((__uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
             *)puVar4,(pointer)0x0);
    pWVar6 = optional_ptr<duckdb::WindowSourceTask,_true>::operator->
                       ((optional_ptr<duckdb::WindowSourceTask,_true> *)this_04._M_head_impl);
    pWVar6->begin_idx = pWVar6->begin_idx + 1;
  }
  return;
}

Assistant:

void WindowLocalSourceState::Sink() {
	D_ASSERT(task);
	D_ASSERT(task->stage == WindowGroupStage::SINK);

	auto &gsink = gsource.gsink;
	const auto &executors = gsink.executors;

	// Create the global state for each function
	// These can be large so we defer building them until we are ready.
	auto &gestates = window_hash_group->Initialize(gsink);

	//	Set up the local states
	auto &local_states = window_hash_group->thread_states.at(task->thread_idx);
	if (local_states.empty()) {
		for (idx_t w = 0; w < executors.size(); ++w) {
			local_states.emplace_back(executors[w]->GetLocalState(*gestates[w]));
		}
	}

	//	First pass over the input without flushing
	for (; task->begin_idx < task->end_idx; ++task->begin_idx) {
		scanner = window_hash_group->GetBuildScanner(task->begin_idx);
		if (!scanner) {
			break;
		}
		while (true) {
			//	TODO: Try to align on validity mask boundaries by starting ragged?
			idx_t input_idx = scanner->Scanned();
			input_chunk.Reset();
			scanner->Scan(input_chunk);
			if (input_chunk.size() == 0) {
				break;
			}

			//	Compute fully materialised expressions
			if (coll_chunk.data.empty()) {
				coll_chunk.SetCardinality(input_chunk);
			} else {
				coll_chunk.Reset();
				coll_exec.Execute(input_chunk, coll_chunk);
				auto collection = window_hash_group->collection.get();
				if (!builder || &builder->collection != collection) {
					builder = make_uniq<WindowBuilder>(*collection);
				}

				builder->Sink(coll_chunk, input_idx);
			}

			// Compute sink expressions
			if (sink_chunk.data.empty()) {
				sink_chunk.SetCardinality(input_chunk);
			} else {
				sink_chunk.Reset();
				sink_exec.Execute(input_chunk, sink_chunk);
			}

			for (idx_t w = 0; w < executors.size(); ++w) {
				executors[w]->Sink(sink_chunk, coll_chunk, input_idx, *gestates[w], *local_states[w]);
			}

			window_hash_group->sunk += input_chunk.size();
		}

		// External scanning assumes all blocks are swizzled.
		scanner->SwizzleBlock(task->begin_idx);
		scanner.reset();
	}
}